

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O2

BOOL __thiscall
Js::DynamicObject::ToPrimitiveImpl<376>
          (DynamicObject *this,Var *result,ScriptContext *requestContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  DynamicObject *pDVar6;
  DynamicObject *pDVar7;
  JavascriptFunction *aValue;
  undefined4 *puVar8;
  Var pvVar9;
  PropertyId propertyId;
  
  bVar3 = JavascriptOperators::CheckIfObjectAndProtoChainHasNoSpecialProperties
                    (&this->super_RecyclableObject);
  if (bVar3) {
    pDVar6 = (DynamicObject *)RecyclableObject::GetPrototype(&this->super_RecyclableObject);
    pDVar7 = JavascriptLibraryBase::GetObjectPrototype
                       (&((requestContext->super_ScriptContextBase).javascriptLibrary)->
                         super_JavascriptLibraryBase);
    if (pDVar6 != pDVar7) goto LAB_00c3ed5d;
    iVar4 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x66])(this);
    if (iVar4 != 0) goto LAB_00c3ed5d;
    pDVar6 = JavascriptLibraryBase::GetObjectPrototype
                       (&((requestContext->super_ScriptContextBase).javascriptLibrary)->
                         super_JavascriptLibraryBase);
    iVar4 = (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x66])(pDVar6);
    if ((iVar4 != 0) ||
       (aValue = (((requestContext->super_ScriptContextBase).javascriptLibrary)->
                 objectToStringFunction).ptr, aValue == (JavascriptFunction *)0x0))
    goto LAB_00c3ed5d;
  }
  else {
LAB_00c3ed5d:
    aValue = (JavascriptFunction *)
             JavascriptOperators::PatchGetValueUsingSpecifiedInlineCache
                       (requestContext->toStringInlineCache,this,&this->super_RecyclableObject,0x178
                        ,requestContext);
    if (aValue != (((requestContext->super_ScriptContextBase).javascriptLibrary)->
                  objectToStringFunction).ptr) {
      BVar5 = CallToPrimitiveFunction(this,aValue,propertyId,result,requestContext);
      return BVar5;
    }
  }
  bVar3 = JavascriptConversion::IsCallable(aValue);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                ,0x1b9,"(JavascriptConversion::IsCallable(aValue))",
                                "JavascriptConversion::IsCallable(aValue)");
    if (!bVar3) goto LAB_00c3ee81;
    *puVar8 = 0;
  }
  TVar1 = ((this->super_RecyclableObject).type.ptr)->typeId;
  if ((TVar1 == TypeIds_HostObject) || (TVar1 == TypeIds_HostDispatch)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                ,0x1bd,
                                "(this->GetTypeId() != TypeIds_HostDispatch && this->GetTypeId() != TypeIds_HostObject)"
                                ,
                                "this->GetTypeId() != TypeIds_HostDispatch && this->GetTypeId() != TypeIds_HostObject"
                               );
    if (!bVar3) {
LAB_00c3ee81:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  pvVar9 = JavascriptObject::ToStringHelper(this,requestContext);
  *result = pvVar9;
  return 1;
}

Assistant:

BOOL DynamicObject::ToPrimitiveImpl(Var* result, ScriptContext * requestContext)
    {
        CompileAssert(propertyId == PropertyIds::valueOf || propertyId == PropertyIds::toString);
        Var aValue = nullptr;
        if (JavascriptOperators::CheckIfObjectAndProtoChainHasNoSpecialProperties(this))
        {
            if (this->GetPrototype() == requestContext->GetLibrary()->GetObjectPrototype() &&
                !this->IsCrossSiteObject() &&
                !requestContext->GetLibrary()->GetObjectPrototype()->IsCrossSiteObject())
            {
                aValue = (propertyId == PropertyIds::valueOf)
                    ? requestContext->GetLibrary()->GetObjectValueOfFunction()
                    : requestContext->GetLibrary()->GetObjectToStringFunction();
            }
        }
        if(!aValue)
        {
            InlineCache * inlineCache = propertyId == PropertyIds::valueOf ? requestContext->GetValueOfInlineCache() : requestContext->GetToStringInlineCache();
            // Use per script context inline cache for valueOf and toString
            aValue = JavascriptOperators::PatchGetValueUsingSpecifiedInlineCache(inlineCache, this, this, propertyId, requestContext);
        }

        // Fast path to the default valueOf/toString implementation
        if (propertyId == PropertyIds::valueOf)
        {
            if (aValue == requestContext->GetLibrary()->GetObjectValueOfFunction())
            {
                Assert(JavascriptConversion::IsCallable(aValue));
                // The default Object.prototype.valueOf will in turn just call ToObject().
                // The result is always an object if it is not undefined or null (which "this" is not)
                return false;
            }
        }
        else
        {
            if (aValue == requestContext->GetLibrary()->GetObjectToStringFunction())
            {
                Assert(JavascriptConversion::IsCallable(aValue));
                // These typeIds should never be here (they override ToPrimitive or they don't derive to DynamicObject::ToPrimitive)
                // Otherwise, they may case implicit call in ToStringHelper
                Assert(this->GetTypeId() != TypeIds_HostDispatch
                    && this->GetTypeId() != TypeIds_HostObject);
                *result = JavascriptObject::ToStringHelper(this, requestContext);
                return true;
            }
        }

        return CallToPrimitiveFunction(aValue, propertyId, result, requestContext);
    }